

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiContext *pIVar1;
  int iVar2;
  bool bVar3;
  ImGuiTabItem *pIVar4;
  ImGuiTabItem *__dest;
  ImGuiShrinkWidthItem *pIVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_1d4;
  bool local_1cd;
  float local_1cc;
  float local_1c4;
  int local_1b4;
  float local_1b0;
  float local_194;
  int local_18c;
  float local_188;
  float local_184;
  int local_180;
  int local_17c;
  ImGuiTabBarSection *local_160;
  ImVec2 local_158;
  ImGuiWindow *local_150;
  ImGuiWindow *window;
  ImGuiTabItem *pIStack_140;
  bool teleport;
  ImGuiTabItem *scroll_track_selected_tab_1;
  ImGuiTabItem *tab_3;
  int *piStack_128;
  int tab_n_2;
  ImGuiTabBarSection *section_1;
  float local_118;
  int section_n_3;
  float tab_offset;
  int section_tab_index;
  int section_n_2;
  float shrinked_width;
  ImGuiTabItem *tab_2;
  int tab_n_1;
  int shrink_data_offset;
  int shrink_data_count;
  float width_excess;
  float fStack_e8;
  bool central_section_is_visible;
  float section_2_w;
  float section_1_w;
  float section_0_w;
  ImGuiTabItem *scroll_track_selected_tab;
  int section_n_1;
  int shrink_buffer_index;
  ImGuiTabBarSection *section;
  int section_n;
  undefined1 local_b9;
  char *pcStack_b8;
  bool has_close_button;
  char *tab_name;
  ImGuiTabItem *tab_1;
  byte local_9d;
  int tab_n;
  bool found_selected_tab_id;
  ImGuiTabItem *pIStack_98;
  int curr_section_n;
  ImGuiTabItem *most_recently_selected_tab;
  int local_88;
  int shrink_buffer_indexes [3];
  ImGuiTabItem *tab_to_select;
  ImGuiID local_70;
  bool tab_list_popup_button;
  ImGuiID scroll_track_selected_tab_id;
  int prev_tab_section_n;
  ImGuiTabItem *prev_tab;
  int curr_tab_section_n;
  ImGuiTabItem *tab;
  undefined1 local_48 [4];
  int tab_src_n;
  ImGuiTabBarSection sections [3];
  int local_1c;
  bool need_sort_by_section;
  int tab_dst_n;
  ImGuiContext *g;
  ImGuiTabBar *tab_bar_local;
  
  pIVar1 = GImGui;
  tab_bar->WantLayout = false;
  local_1c = 0;
  sections[2].Spacing._3_1_ = 0;
  local_160 = (ImGuiTabBarSection *)local_48;
  do {
    ImGuiTabBarSection::ImGuiTabBarSection(local_160);
    local_160 = local_160 + 1;
  } while (local_160 != (ImGuiTabBarSection *)&sections[2].Width);
  for (tab._4_4_ = 0; tab._4_4_ < (tab_bar->Tabs).Size; tab._4_4_ = tab._4_4_ + 1) {
    pIVar4 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
    if ((pIVar4->LastFrameVisible < tab_bar->PrevFrameVisible) || ((pIVar4->WantClose & 1U) != 0)) {
      if (tab_bar->VisibleTabId == pIVar4->ID) {
        tab_bar->VisibleTabId = 0;
      }
      if (tab_bar->SelectedTabId == pIVar4->ID) {
        tab_bar->SelectedTabId = 0;
      }
      if (tab_bar->NextSelectedTabId == pIVar4->ID) {
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      if (local_1c != tab._4_4_) {
        pIVar4 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
        __dest = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_1c);
        memcpy(__dest,pIVar4,0x2b);
      }
      pIVar4 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_1c);
      pIVar4->IndexDuringLayout = (ImS16)local_1c;
      if ((pIVar4->Flags & 0x40U) == 0) {
        local_17c = 1;
        if ((pIVar4->Flags & 0x80U) != 0) {
          local_17c = 2;
        }
      }
      else {
        local_17c = 0;
      }
      if (0 < local_1c) {
        pIVar4 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_1c + -1);
        if ((pIVar4->Flags & 0x40U) == 0) {
          local_180 = 1;
          if ((pIVar4->Flags & 0x80U) != 0) {
            local_180 = 2;
          }
        }
        else {
          local_180 = 0;
        }
        if ((local_17c == 0) && (local_180 != 0)) {
          sections[2].Spacing._3_1_ = 1;
        }
        if ((local_180 == 2) && (local_17c != 2)) {
          sections[2].Spacing._3_1_ = 1;
        }
      }
      *(int *)(local_48 + (long)local_17c * 0xc) = *(int *)(local_48 + (long)local_17c * 0xc) + 1;
      local_1c = local_1c + 1;
    }
  }
  if ((tab_bar->Tabs).Size != local_1c) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,local_1c);
  }
  if ((sections[2].Spacing._3_1_ & 1) != 0) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x30,TabItemComparerBySection);
  }
  if (((int)local_48 < 1) || ((int)sections[0].Width + (int)sections[1].Width < 1)) {
    local_184 = 0.0;
  }
  else {
    local_184 = (pIVar1->Style).ItemInnerSpacing.x;
  }
  sections[0].TabCount = (int)local_184;
  if (((int)sections[0].Width < 1) || ((int)sections[1].Width < 1)) {
    local_188 = 0.0;
  }
  else {
    local_188 = (pIVar1->Style).ItemInnerSpacing.x;
  }
  sections[1].TabCount = (int)local_188;
  local_70 = 0;
  if (tab_bar->NextSelectedTabId != 0) {
    tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
    tab_bar->NextSelectedTabId = 0;
    local_70 = tab_bar->SelectedTabId;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar3 = TabBarProcessReorder(tab_bar);
    if ((bVar3) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_70 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  if (((tab_bar->Flags & 4U) != 0) &&
     (shrink_buffer_indexes._4_8_ = TabBarTabListPopupButton(tab_bar),
     (ImGuiTabItem *)shrink_buffer_indexes._4_8_ != (ImGuiTabItem *)0x0)) {
    local_70 = ((ImGuiTabItem *)shrink_buffer_indexes._4_8_)->ID;
    tab_bar->SelectedTabId = local_70;
  }
  most_recently_selected_tab._4_4_ = 0;
  local_88 = (int)local_48 + (int)sections[1].Width;
  shrink_buffer_indexes[0] = (int)local_48;
  ImVector<ImGuiShrinkWidthItem>::resize(&pIVar1->ShrinkWidthBuffer,(tab_bar->Tabs).Size);
  pIStack_98 = (ImGuiTabItem *)0x0;
  tab_n = -1;
  local_9d = 0;
  tab_1._4_4_ = 0;
  while( true ) {
    if ((tab_bar->Tabs).Size <= tab_1._4_4_) {
      tab_bar->WidthAllTabsIdeal = 0.0;
      for (scroll_track_selected_tab._0_4_ = 0; (int)scroll_track_selected_tab < 3;
          scroll_track_selected_tab._0_4_ = (int)scroll_track_selected_tab + 1) {
        tab_bar->WidthAllTabsIdeal =
             sections[(long)(int)scroll_track_selected_tab + -1].Spacing +
             (float)sections[(int)scroll_track_selected_tab].TabCount + tab_bar->WidthAllTabsIdeal;
      }
      fVar9 = tab_bar->WidthAllTabsIdeal;
      fVar7 = ImRect::GetWidth(&tab_bar->BarRect);
      if ((((fVar7 < fVar9) && (1 < (tab_bar->Tabs).Size)) && ((tab_bar->Flags & 0x10U) == 0)) &&
         ((((tab_bar->Flags & 0x80U) != 0 &&
           (_section_1_w = TabBarScrollingButtons(tab_bar), _section_1_w != (ImGuiTabItem *)0x0)) &&
          (local_70 = _section_1_w->ID, (_section_1_w->Flags & 0x200000U) == 0)))) {
        tab_bar->SelectedTabId = local_70;
      }
      section_2_w = (float)tab_src_n + (float)sections[0].TabCount;
      fStack_e8 = sections[0].Spacing + (float)sections[1].TabCount;
      width_excess = sections[1].Spacing + (float)sections[2].TabCount;
      fVar7 = section_2_w + width_excess;
      fVar8 = ImRect::GetWidth(&tab_bar->BarRect);
      fVar9 = fStack_e8;
      shrink_data_count._3_1_ = fVar7 < fVar8;
      if ((bool)shrink_data_count._3_1_) {
        fVar7 = ImRect::GetWidth(&tab_bar->BarRect);
        shrink_data_offset = (int)ImMax<float>(fVar9 - ((fVar7 - section_2_w) - width_excess),0.0);
      }
      else {
        fVar9 = section_2_w + width_excess;
        fVar7 = ImRect::GetWidth(&tab_bar->BarRect);
        shrink_data_offset = (int)(fVar9 - fVar7);
      }
      if ((0.0 < (float)shrink_data_offset) &&
         (((tab_bar->Flags & 0x40U) != 0 || ((shrink_data_count._3_1_ & 1) == 0)))) {
        if ((shrink_data_count._3_1_ & 1) == 0) {
          local_1b0 = (float)((int)local_48 + (int)sections[1].Width);
        }
        else {
          local_1b0 = sections[0].Width;
        }
        tab_n_1 = (int)local_1b0;
        if ((shrink_data_count._3_1_ & 1) == 0) {
          local_1b4 = 0;
        }
        else {
          local_1b4 = (int)local_48 + (int)sections[1].Width;
        }
        tab_2._4_4_ = local_1b4;
        ShrinkWidths((pIVar1->ShrinkWidthBuffer).Data + local_1b4,(int)local_1b0,
                     (float)shrink_data_offset);
        for (tab_2._0_4_ = tab_2._4_4_; (int)tab_2 < tab_2._4_4_ + tab_n_1;
            tab_2._0_4_ = (int)tab_2 + 1) {
          pIVar5 = ImVector<ImGuiShrinkWidthItem>::operator[](&pIVar1->ShrinkWidthBuffer,(int)tab_2)
          ;
          _section_n_2 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar5->Index);
          pIVar5 = ImVector<ImGuiShrinkWidthItem>::operator[](&pIVar1->ShrinkWidthBuffer,(int)tab_2)
          ;
          section_tab_index = (int)(float)(int)pIVar5->Width;
          if (0.0 <= (float)section_tab_index) {
            if ((_section_n_2->Flags & 0x40U) == 0) {
              local_1c4 = 1.4013e-45;
              if ((_section_n_2->Flags & 0x80U) != 0) {
                local_1c4 = 2.8026e-45;
              }
            }
            else {
              local_1c4 = 0.0;
            }
            tab_offset = local_1c4;
            sections[(long)(int)local_1c4 + -1].Spacing =
                 sections[(long)(int)local_1c4 + -1].Spacing -
                 (_section_n_2->Width - (float)section_tab_index);
            _section_n_2->Width = (float)section_tab_index;
          }
        }
      }
      section_n_3 = 0;
      local_118 = 0.0;
      tab_bar->WidthAllTabs = 0.0;
      for (section_1._4_4_ = 0; section_1._4_4_ < 3; section_1._4_4_ = section_1._4_4_ + 1) {
        piStack_128 = (int *)(local_48 + (long)section_1._4_4_ * 0xc);
        if (section_1._4_4_ == 2) {
          fVar9 = ImRect::GetWidth(&tab_bar->BarRect);
          fVar9 = ImMax<float>(0.0,fVar9 - (float)piStack_128[1]);
          local_118 = ImMin<float>(fVar9,local_118);
        }
        for (tab_3._4_4_ = 0; tab_3._4_4_ < *piStack_128; tab_3._4_4_ = tab_3._4_4_ + 1) {
          scroll_track_selected_tab_1 =
               ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,section_n_3 + tab_3._4_4_);
          scroll_track_selected_tab_1->Offset = local_118;
          scroll_track_selected_tab_1->NameOffset = -1;
          if (tab_3._4_4_ < *piStack_128 + -1) {
            local_1cc = (pIVar1->Style).ItemInnerSpacing.x;
          }
          else {
            local_1cc = 0.0;
          }
          local_118 = scroll_track_selected_tab_1->Width + local_1cc + local_118;
        }
        fVar9 = ImMax<float>((float)piStack_128[1] + (float)piStack_128[2],0.0);
        tab_bar->WidthAllTabs = fVar9 + tab_bar->WidthAllTabs;
        local_118 = (float)piStack_128[2] + local_118;
        section_n_3 = *piStack_128 + section_n_3;
      }
      ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
      if ((local_9d & 1) == 0) {
        tab_bar->SelectedTabId = 0;
      }
      if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
         (pIStack_98 != (ImGuiTabItem *)0x0)) {
        local_70 = pIStack_98->ID;
        tab_bar->SelectedTabId = local_70;
      }
      tab_bar->VisibleTabId = tab_bar->SelectedTabId;
      tab_bar->VisibleTabWasSubmitted = false;
      if (((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
          (pIVar1->NavWindowingTarget->DockNode != (ImGuiDockNode *)0x0)) &&
         (pIVar1->NavWindowingTarget->DockNode->TabBar == tab_bar)) {
        local_70 = pIVar1->NavWindowingTarget->ID;
        tab_bar->VisibleTabId = local_70;
      }
      if ((local_70 != 0) &&
         (pIStack_140 = TabBarFindTabByID(tab_bar,local_70), pIStack_140 != (ImGuiTabItem *)0x0)) {
        TabBarScrollToTab(tab_bar,pIStack_140,(ImGuiTabBarSection *)local_48);
      }
      fVar9 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
      tab_bar->ScrollingAnim = fVar9;
      fVar9 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
      tab_bar->ScrollingTarget = fVar9;
      if ((tab_bar->ScrollingAnim != tab_bar->ScrollingTarget) ||
         (NAN(tab_bar->ScrollingAnim) || NAN(tab_bar->ScrollingTarget))) {
        fVar9 = ImMax<float>(tab_bar->ScrollingSpeed,pIVar1->FontSize * 70.0);
        tab_bar->ScrollingSpeed = fVar9;
        fVar9 = ImMax<float>(tab_bar->ScrollingSpeed,
                             ABS(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3);
        tab_bar->ScrollingSpeed = fVar9;
        local_1cd = true;
        if (pIVar1->FrameCount <= tab_bar->PrevFrameVisible + 1) {
          local_1cd = pIVar1->FontSize * 10.0 < tab_bar->ScrollingTargetDistToVisibility;
        }
        window._7_1_ = local_1cd;
        if (local_1cd == false) {
          local_1d4 = ImLinearSweep(tab_bar->ScrollingAnim,tab_bar->ScrollingTarget,
                                    (pIVar1->IO).DeltaTime * tab_bar->ScrollingSpeed);
        }
        else {
          local_1d4 = tab_bar->ScrollingTarget;
        }
        tab_bar->ScrollingAnim = local_1d4;
      }
      else {
        tab_bar->ScrollingSpeed = 0.0;
      }
      tab_bar->ScrollingRectMinX =
           (tab_bar->BarRect).Min.x + (float)tab_src_n + (float)sections[0].TabCount;
      tab_bar->ScrollingRectMaxX =
           ((tab_bar->BarRect).Max.x - sections[1].Spacing) - (float)sections[1].TabCount;
      local_150 = pIVar1->CurrentWindow;
      (local_150->DC).CursorPos = (tab_bar->BarRect).Min;
      fVar9 = tab_bar->WidthAllTabsIdeal;
      fVar7 = ImRect::GetHeight(&tab_bar->BarRect);
      ImVec2::ImVec2(&local_158,fVar9,fVar7);
      ItemSize(&local_158,(tab_bar->FramePadding).y);
      return;
    }
    tab_name = (char *)ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab_1._4_4_);
    if (((ImGuiTabItem *)tab_name)->LastFrameVisible < tab_bar->PrevFrameVisible) break;
    if (((pIStack_98 == (ImGuiTabItem *)0x0) ||
        (pIStack_98->LastFrameSelected < ((ImGuiTabItem *)tab_name)->LastFrameSelected)) &&
       ((((ImGuiTabItem *)tab_name)->Flags & 0x200000U) == 0)) {
      pIStack_98 = (ImGuiTabItem *)tab_name;
    }
    if (((ImGuiTabItem *)tab_name)->ID == tab_bar->SelectedTabId) {
      local_9d = 1;
    }
    if ((local_70 == 0) && (pIVar1->NavJustMovedToId == ((ImGuiTabItem *)tab_name)->ID)) {
      local_70 = ((ImGuiTabItem *)tab_name)->ID;
    }
    pcStack_b8 = ImGuiTabBar::GetTabName(tab_bar,(ImGuiTabItem *)tab_name);
    local_b9 = (*(uint *)(tab_name + 4) & 0x100000) == 0;
    register0x00001200 = TabItemCalcSize(pcStack_b8,(bool)local_b9);
    iVar2 = tab_1._4_4_;
    *(float *)(tab_name + 0x20) = section._4_4_;
    if ((*(uint *)(tab_name + 4) & 0x40) == 0) {
      local_18c = 1;
      if ((*(uint *)(tab_name + 4) & 0x80) != 0) {
        local_18c = 2;
      }
    }
    else {
      local_18c = 0;
    }
    section._0_4_ = local_18c;
    lVar6 = (long)local_18c;
    _section_n_1 = local_48 + lVar6 * 0xc;
    if (local_18c == tab_n) {
      local_194 = (pIVar1->Style).ItemInnerSpacing.x;
    }
    else {
      local_194 = 0.0;
    }
    sections[lVar6 + -1].Spacing =
         *(float *)(tab_name + 0x20) + local_194 + sections[lVar6 + -1].Spacing;
    tab_n = local_18c;
    scroll_track_selected_tab._4_4_ =
         *(int *)((long)&most_recently_selected_tab + (long)local_18c * 4 + 4);
    *(int *)((long)&most_recently_selected_tab + (long)local_18c * 4 + 4) =
         scroll_track_selected_tab._4_4_ + 1;
    pIVar5 = ImVector<ImGuiShrinkWidthItem>::operator[]
                       (&pIVar1->ShrinkWidthBuffer,scroll_track_selected_tab._4_4_);
    pIVar5->Index = iVar2;
    fVar9 = *(float *)(tab_name + 0x20);
    pIVar5 = ImVector<ImGuiShrinkWidthItem>::operator[]
                       (&pIVar1->ShrinkWidthBuffer,scroll_track_selected_tab._4_4_);
    pIVar5->Width = fVar9;
    if (*(float *)(tab_name + 0x20) <= 0.0) {
      __assert_fail("tab->ContentWidth > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x1bc5,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    *(undefined4 *)(tab_name + 0x1c) = *(undefined4 *)(tab_name + 0x20);
    tab_1._4_4_ = tab_1._4_4_ + 1;
  }
  __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                ,0x1bab,"void ImGui::TabBarLayout(ImGuiTabBar *)");
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_track_selected_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}